

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage_module.h
# Opt level: O0

void __thiscall
shift_window_transformer::StageModule<float>::StageModule
          (StageModule<float> *this,int in_channels,int hidden_dimension,int layers_cnt,
          int downscaling_factor,int num_heads,int head_dim,int window_size,
          bool relative_pos_embedding)

{
  SwinBlock<float> *pSVar1;
  SwinBlock<float> *local_50;
  SwinBlock<float> *ptr2;
  SwinBlock<float> *local_38;
  SwinBlock<float> *ptr1;
  byte local_25;
  int i;
  int iStack_20;
  bool relative_pos_embedding_local;
  int num_heads_local;
  int downscaling_factor_local;
  int layers_cnt_local;
  int hidden_dimension_local;
  int in_channels_local;
  StageModule<float> *this_local;
  
  local_25 = relative_pos_embedding;
  i = num_heads;
  iStack_20 = downscaling_factor;
  num_heads_local = layers_cnt;
  downscaling_factor_local = hidden_dimension;
  layers_cnt_local = in_channels;
  _hidden_dimension_local = this;
  Layer<float>::Layer(&this->super_Layer<float>);
  (this->super_Layer<float>)._vptr_Layer = (_func_int **)&PTR_forward_0011c9b0;
  PatchMerging<float>::PatchMerging
            (&this->patch_partition,layers_cnt_local,downscaling_factor_local,iStack_20);
  std::
  vector<shift_window_transformer::SwinBlock<float>_*,_std::allocator<shift_window_transformer::SwinBlock<float>_*>_>
  ::vector(&this->layers);
  if (num_heads_local % 2 == 0) {
    for (ptr1._4_4_ = 0; ptr1._4_4_ < num_heads_local; ptr1._4_4_ = ptr1._4_4_ + 2) {
      pSVar1 = (SwinBlock<float> *)operator_new(0x38);
      SwinBlock<float>::SwinBlock
                (pSVar1,downscaling_factor_local,i,head_dim,downscaling_factor_local << 2,false,
                 window_size,(bool)(local_25 & 1));
      local_38 = pSVar1;
      pSVar1 = (SwinBlock<float> *)operator_new(0x38);
      SwinBlock<float>::SwinBlock
                (pSVar1,downscaling_factor_local,i,head_dim,downscaling_factor_local << 2,true,
                 window_size,(bool)(local_25 & 1));
      local_50 = pSVar1;
      std::
      vector<shift_window_transformer::SwinBlock<float>_*,_std::allocator<shift_window_transformer::SwinBlock<float>_*>_>
      ::push_back(&this->layers,&local_38);
      std::
      vector<shift_window_transformer::SwinBlock<float>_*,_std::allocator<shift_window_transformer::SwinBlock<float>_*>_>
      ::push_back(&this->layers,&local_50);
    }
    return;
  }
  __assert_fail("layers_cnt % 2 == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/dianhsu[P]swin-transformer-cpp/model/stage_module.h"
                ,0x16,
                "shift_window_transformer::StageModule<float>::StageModule(int, int, int, int, int, int, int, bool) [T = float]"
               );
}

Assistant:

StageModule(int in_channels, int hidden_dimension, int layers_cnt, int downscaling_factor, int num_heads,
                    int head_dim, int window_size, bool relative_pos_embedding) : patch_partition(in_channels,
                                                                                                  hidden_dimension,
                                                                                                  downscaling_factor) {
            assert(layers_cnt % 2 == 0);

            for (int i = 0; i < layers_cnt; i += 2) {
                auto ptr1 = new SwinBlock<T>(hidden_dimension, num_heads, head_dim, hidden_dimension * 4, false,
                                             window_size,
                                             relative_pos_embedding);
                auto ptr2 = new SwinBlock<T>(hidden_dimension, num_heads, head_dim, hidden_dimension * 4, true,
                                             window_size,
                                             relative_pos_embedding);
                layers.push_back(ptr1);
                layers.push_back(ptr2);
            }
        }